

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

bool __thiscall cppnet::Bitmap::Init(Bitmap *this,uint32_t size)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_28;
  size_t i;
  uint32_t vec_size;
  uint32_t size_local;
  Bitmap *this_local;
  
  i._0_4_ = size >> 6;
  if ((uint)i < 0x21) {
    if ((size & 0x3f) != 0) {
      i._0_4_ = (uint)i + 1;
    }
    std::vector<long,_std::allocator<long>_>::resize(&this->_bitmap,(ulong)(uint)i);
    local_28 = 0;
    while( true ) {
      sVar1 = std::vector<long,_std::allocator<long>_>::size(&this->_bitmap);
      if (sVar1 <= local_28) break;
      pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](&this->_bitmap,local_28);
      *pvVar2 = 0;
      local_28 = local_28 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Bitmap::Init(uint32_t size) {
    uint32_t vec_size = size / __step_size;
    // too large size
    if (vec_size > sizeof(_vec_bitmap) * 8) {
        return false;
    }
    if (size % __step_size > 0) {
        vec_size++;
    }
    _bitmap.resize(vec_size);
    for (std::size_t i = 0; i < _bitmap.size(); i++) {
        _bitmap[i] = 0;
    }
    return true;
}